

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O3

void ares_llist_node_replace(ares_llist_node_t *node,void *val)

{
  ares_llist_destructor_t p_Var1;
  
  if (node != (ares_llist_node_t *)0x0) {
    p_Var1 = node->parent->destruct;
    if (p_Var1 != (ares_llist_destructor_t)0x0) {
      (*p_Var1)(node->data);
    }
    node->data = val;
  }
  return;
}

Assistant:

void ares_llist_node_replace(ares_llist_node_t *node, void *val)
{
  ares_llist_destructor_t destruct;

  if (node == NULL) {
    return;
  }

  destruct = node->parent->destruct;
  if (destruct != NULL) {
    destruct(node->data);
  }

  node->data = val;
}